

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl.c
# Opt level: O2

int gladLoaderLoadGL(void)

{
  int iVar1;
  void *pvVar2;
  long lVar3;
  _glad_gl_userptr userptr;
  
  lVar3 = 0;
  do {
    if (lVar3 == 0x10) {
      return 0;
    }
    pvVar2 = (void *)dlopen(*(undefined8 *)((long)gladLoaderLoadGL::NAMES + lVar3),1);
    lVar3 = lVar3 + 8;
  } while (pvVar2 == (void *)0x0);
  userptr.gl_handle = pvVar2;
  userptr.gl_get_proc_address_ptr = (GLADglprocaddrfunc)dlsym(pvVar2,"glXGetProcAddressARB");
  iVar1 = gladLoadGLUserPtr(glad_gl_get_proc,&userptr);
  dlclose(pvVar2);
  return iVar1;
}

Assistant:

int gladLoaderLoadGL(void) {
#ifdef __APPLE__
    static const char *NAMES[] = {
        "../Frameworks/OpenGL.framework/OpenGL",
        "/Library/Frameworks/OpenGL.framework/OpenGL",
        "/System/Library/Frameworks/OpenGL.framework/OpenGL",
        "/System/Library/Frameworks/OpenGL.framework/Versions/Current/OpenGL"
    };
#elif GLAD_PLATFORM_WIN32
    static const char *NAMES[] = {"opengl32.dll"};
#else
    static const char *NAMES[] = {
#if defined __CYGWIN__
        "libGL-1.so",
#endif
        "libGL.so.1",
        "libGL.so"
    };
#endif

    int version = 0;
    void *handle;
    struct _glad_gl_userptr userptr;

    handle = glad_get_dlopen_handle(NAMES, sizeof(NAMES) / sizeof(NAMES[0]));
    if (handle) {
        userptr.gl_handle = handle;
#ifdef __APPLE__
        userptr.gl_get_proc_address_ptr = NULL;
#elif GLAD_PLATFORM_WIN32
        userptr.gl_get_proc_address_ptr =
            (GLADglprocaddrfunc) glad_dlsym_handle(handle, "wglGetProcAddress");
#else
        userptr.gl_get_proc_address_ptr =
            (GLADglprocaddrfunc) glad_dlsym_handle(handle, "glXGetProcAddressARB");
#endif
        version = gladLoadGLUserPtr(glad_gl_get_proc, &userptr);

        glad_close_dlopen_handle(handle);
    }

    return version;
}